

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O1

bool ParameterTraits<std::pair<int,_int>_>::convert(string *v,RepType *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  StringTokenizer tokenizer;
  string local_98;
  StringTokenizer local_78;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," ;,\t\n\r","");
  OpenMD::StringTokenizer::StringTokenizer(&local_78,v,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  iVar1 = OpenMD::StringTokenizer::countTokens(&local_78);
  if (iVar1 == 2) {
    iVar2 = OpenMD::StringTokenizer::nextTokenAsInt(&local_78);
    iVar3 = OpenMD::StringTokenizer::nextTokenAsInt(&local_78);
    r->first = iVar2;
    r->second = iVar3;
  }
  else {
    memcpy(&painCave,"ParameterManager Error: Incorrect number of tokens to make a pair!\n",0x44);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.delim_._M_dataplus._M_p != &local_78.delim_.field_2) {
    operator_delete(local_78.delim_._M_dataplus._M_p,
                    local_78.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.tokenString_._M_dataplus._M_p != &local_78.tokenString_.field_2) {
    operator_delete(local_78.tokenString_._M_dataplus._M_p,
                    local_78.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return iVar1 == 2;
}

Assistant:

static bool convert(std::string v, RepType& r) {
    OpenMD::StringTokenizer tokenizer(v, " ;,\t\n\r");
    if (tokenizer.countTokens() == 2) {
      int atom1 = tokenizer.nextTokenAsInt();
      int atom2 = tokenizer.nextTokenAsInt();
      r         = std::make_pair(atom1, atom2);
      return true;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ParameterManager Error: "
               "Incorrect number of tokens to make a pair!\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    return false;
  }